

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::JoinDefines
          (cmLocalGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *defines,string *definesString,string *lang)

{
  _Rb_tree_node_base *p_Var1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  _Base_ptr p_Var5;
  byte *pbVar6;
  char cVar7;
  string defineFlagVar;
  string local_90;
  string dflag;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dflag,"-D",(allocator<char> *)&defineFlagVar);
  if (lang->_M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&defineFlagVar,"CMAKE_",(allocator<char> *)&local_90);
    std::__cxx11::string::append((string *)&defineFlagVar);
    std::__cxx11::string::append((char *)&defineFlagVar);
    pcVar3 = cmMakefile::GetDefinition(this->Makefile,&defineFlagVar);
    if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
      std::__cxx11::string::assign((char *)&dflag);
    }
    std::__cxx11::string::~string((string *)&defineFlagVar);
  }
  p_Var5 = (defines->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var5 == &(defines->_M_t)._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::~string((string *)&dflag);
      return;
    }
    std::__cxx11::string::string((string *)&defineFlagVar,(string *)&dflag);
    bVar2 = cmState::UseWatcomWMake
                      ((this->GlobalGenerator->CMakeInstance->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    p_Var1 = p_Var5 + 1;
    if (bVar2) break;
    lVar4 = std::__cxx11::string::find((char)p_Var1,0x3d);
    std::__cxx11::string::substr((ulong)&local_90,(ulong)p_Var1);
    std::__cxx11::string::append((string *)&defineFlagVar);
    std::__cxx11::string::~string((string *)&local_90);
    if (lVar4 != -1) {
      std::__cxx11::string::append((char *)&defineFlagVar);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)p_Var1);
      cmOutputConverter::EscapeForShell
                (&local_90,&this->super_cmOutputConverter,&local_50,true,false,false);
      std::__cxx11::string::append((string *)&defineFlagVar);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
LAB_0015cbfb:
    std::__cxx11::string::append((char *)definesString);
    std::__cxx11::string::append((string *)definesString);
    std::__cxx11::string::~string((string *)&defineFlagVar);
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  }
  pbVar6 = *(byte **)p_Var1;
  do {
    cVar7 = (char)&defineFlagVar;
    if (*pbVar6 - 0x23 < 2) {
      std::__cxx11::string::push_back(cVar7);
    }
    else if (*pbVar6 == 0) goto LAB_0015cbfb;
    std::__cxx11::string::push_back(cVar7);
    pbVar6 = pbVar6 + 1;
  } while( true );
}

Assistant:

void cmLocalGenerator::JoinDefines(const std::set<std::string>& defines,
                                   std::string& definesString,
                                   const std::string& lang)
{
  // Lookup the define flag for the current language.
  std::string dflag = "-D";
  if (!lang.empty()) {
    std::string defineFlagVar = "CMAKE_";
    defineFlagVar += lang;
    defineFlagVar += "_DEFINE_FLAG";
    const char* df = this->Makefile->GetDefinition(defineFlagVar);
    if (df && *df) {
      dflag = df;
    }
  }
  const char* itemSeparator = definesString.empty() ? "" : " ";
  for (std::string const& define : defines) {
    // Append the definition with proper escaping.
    std::string def = dflag;
    if (this->GetState()->UseWatcomWMake()) {
      // The Watcom compiler does its own command line parsing instead
      // of using the windows shell rules.  Definitions are one of
      //   -DNAME
      //   -DNAME=<cpp-token>
      //   -DNAME="c-string with spaces and other characters(?@#$)"
      //
      // Watcom will properly parse each of these cases from the
      // command line without any escapes.  However we still have to
      // get the '$' and '#' characters through WMake as '$$' and
      // '$#'.
      for (const char* c = define.c_str(); *c; ++c) {
        if (*c == '$' || *c == '#') {
          def += '$';
        }
        def += *c;
      }
    } else {
      // Make the definition appear properly on the command line.  Use
      // -DNAME="value" instead of -D"NAME=value" for historical reasons.
      std::string::size_type eq = define.find('=');
      def += define.substr(0, eq);
      if (eq != std::string::npos) {
        def += "=";
        def += this->EscapeForShell(define.substr(eq + 1), true);
      }
    }
    definesString += itemSeparator;
    itemSeparator = " ";
    definesString += def;
  }
}